

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.hpp
# Opt level: O2

bool __thiscall libtorrent::digest32<160L>::operator<(digest32<160L> *this,digest32<160L> *n)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x14) {
      return false;
    }
    uVar3 = *(uint *)((long)(this->m_number)._M_elems + lVar1);
    uVar2 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = *(uint *)((long)(n->m_number)._M_elems + lVar1);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    if (uVar2 < uVar3) break;
    lVar1 = lVar1 + 4;
    if (uVar3 < uVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool operator<(digest32 const& n) const noexcept
		{
			for (auto const v : boost::combine(m_number, n.m_number))
			{
				std::uint32_t const lhs = aux::network_to_host(boost::get<0>(v));
				std::uint32_t const rhs = aux::network_to_host(boost::get<1>(v));
				if (lhs < rhs) return true;
				if (lhs > rhs) return false;
			}
			return false;
		}